

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O0

void __thiscall
SRCTools::FIRResampler::getOutSamplesStereo(FIRResampler *this,FloatSample **outSamples)

{
  FloatSample *pFVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  uint local_5c;
  uint local_40;
  FIRCoefficient tap_1;
  uint tapIx_1;
  FIRCoefficient tap;
  uint tapIx;
  uint maxTapIx;
  double phaseFraction;
  float local_20;
  uint delaySampleIx;
  FloatSample rightSample;
  FloatSample leftSample;
  FloatSample **outSamples_local;
  FIRResampler *this_local;
  
  delaySampleIx = 0;
  local_20 = 0.0;
  phaseFraction._4_4_ = this->ringBufferPosition;
  if (((this->constants).usePhaseInterpolation & 1U) == 0) {
    for (local_40 = (uint)(long)this->phase; local_40 < (this->constants).numberOfTaps;
        local_40 = (this->constants).numberOfPhases + local_40) {
      fVar2 = (this->constants).taps[local_40];
      delaySampleIx =
           (uint)(fVar2 * (this->constants).ringBuffer[phaseFraction._4_4_][0] +
                 (float)delaySampleIx);
      local_20 = fVar2 * (this->constants).ringBuffer[phaseFraction._4_4_][1] + local_20;
      phaseFraction._4_4_ = phaseFraction._4_4_ + 1 & (this->constants).delayLineMask;
    }
  }
  else {
    dVar4 = this->phase;
    dVar3 = floor(this->phase);
    dVar4 = dVar4 - dVar3;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      local_5c = (this->constants).numberOfTaps - 1;
    }
    else {
      local_5c = (this->constants).numberOfTaps;
    }
    for (tapIx_1 = (uint)(long)this->phase; tapIx_1 < local_5c;
        tapIx_1 = (this->constants).numberOfPhases + tapIx_1) {
      fVar2 = (float)((double)((this->constants).taps[tapIx_1 + 1] - (this->constants).taps[tapIx_1]
                              ) * dVar4 + (double)(this->constants).taps[tapIx_1]);
      delaySampleIx =
           (uint)(fVar2 * (this->constants).ringBuffer[phaseFraction._4_4_][0] +
                 (float)delaySampleIx);
      local_20 = fVar2 * (this->constants).ringBuffer[phaseFraction._4_4_][1] + local_20;
      phaseFraction._4_4_ = phaseFraction._4_4_ + 1 & (this->constants).delayLineMask;
    }
  }
  pFVar1 = *outSamples;
  *outSamples = pFVar1 + 1;
  *pFVar1 = (FloatSample)delaySampleIx;
  pFVar1 = *outSamples;
  *outSamples = pFVar1 + 1;
  *pFVar1 = local_20;
  this->phase = (this->constants).phaseIncrement + this->phase;
  return;
}

Assistant:

void FIRResampler::getOutSamplesStereo(FloatSample *&outSamples) {
	FloatSample leftSample = 0.0;
	FloatSample rightSample = 0.0;
	unsigned int delaySampleIx = ringBufferPosition;
	if (constants.usePhaseInterpolation) {
		double phaseFraction = phase - floor(phase);
		unsigned int maxTapIx = phaseFraction == 0 ? constants.numberOfTaps : constants.numberOfTaps - 1;
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < maxTapIx; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = FIRCoefficient(constants.taps[tapIx] + (constants.taps[tapIx + 1] - constants.taps[tapIx]) * phaseFraction);
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	} else {
		// Optimised for rational resampling ratios when phase is always integer
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < constants.numberOfTaps; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = constants.taps[tapIx];
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	}
	*(outSamples++) = leftSample;
	*(outSamples++) = rightSample;
	phase += constants.phaseIncrement;
}